

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O0

void __thiscall IntersectionHelper::step_single(IntersectionHelper *this)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 *puVar3;
  uint32_t uVar4;
  uint uVar5;
  uint8_t *puVar6;
  undefined8 *in_RDI;
  uint32_t next;
  
  iVar1 = *(int *)(in_RDI + 2);
  uVar4 = run_read((uint8_t *)*in_RDI);
  uVar5 = iVar1 + uVar4;
  if (uVar5 < *(uint *)in_RDI[4]) {
    *(uint *)(in_RDI + 2) = uVar5;
    puVar6 = run_forward((uint8_t *)*in_RDI);
    *in_RDI = puVar6;
  }
  else {
    if (*(uint *)in_RDI[4] == uVar5) {
      uVar2 = *(undefined4 *)in_RDI[4];
      puVar3 = (undefined4 *)in_RDI[6];
      in_RDI[6] = puVar3 + 1;
      *puVar3 = uVar2;
      *(uint *)(in_RDI + 2) = uVar5;
      puVar6 = run_forward((uint8_t *)*in_RDI);
      *in_RDI = puVar6;
    }
    in_RDI[4] = in_RDI[4] + 4;
  }
  return;
}

Assistant:

void IntersectionHelper::step_single() {
    uint32_t next = prev_ + run_read(run_it_);
    if (next < *seq_it_) {
        prev_ = next;
        run_it_ = run_forward(run_it_);
        return;
    }
    if (*seq_it_ == next) {
        *seq_out_++ = *seq_it_;
        prev_ = next;
        run_it_ = run_forward(run_it_);
    }
    seq_it_++;
}